

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

roaring_bitmap_t * synthesized_xor(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  uint64_t range_end;
  char *file;
  roaring_bitmap_t *prVar1;
  roaring_bitmap_t *r1_xor_r2;
  roaring_bitmap_t *r1_nand_r2;
  roaring_bitmap_t *r1_and_r2;
  roaring_bitmap_t *r1_or_r2;
  roaring_statistics_t stats;
  uint universe_size;
  char *in_stack_ffffffffffffff80;
  roaring_bitmap_t *in_stack_ffffffffffffff88;
  roaring_bitmap_t *in_stack_ffffffffffffff90;
  roaring_statistics_t *in_stack_ffffffffffffff98;
  roaring_bitmap_t *in_stack_ffffffffffffffa0;
  roaring_bitmap_t *in_stack_ffffffffffffffa8;
  roaring_bitmap_t *in_stack_ffffffffffffffb0;
  roaring_bitmap_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  roaring_bitmap_statistics(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  roaring_bitmap_statistics(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  roaring_bitmap_or(r1_nand_r2,r1_xor_r2);
  range_end = roaring_bitmap_get_cardinality(in_stack_ffffffffffffff90);
  roaring_bitmap_or_cardinality(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  _assert_true((unsigned_long)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,(int)(range_end >> 0x20));
  roaring_bitmap_and((roaring_bitmap_t *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  file = (char *)roaring_bitmap_get_cardinality(in_stack_ffffffffffffff90);
  roaring_bitmap_and_cardinality(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  _assert_true((unsigned_long)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,file,
               (int)(range_end >> 0x20));
  roaring_bitmap_flip(in_stack_ffffffffffffff88,(uint64_t)file,range_end);
  prVar1 = roaring_bitmap_and((roaring_bitmap_t *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffc8);
  roaring_bitmap_free((roaring_bitmap_t *)0x106ddd);
  roaring_bitmap_free((roaring_bitmap_t *)0x106de7);
  roaring_bitmap_free((roaring_bitmap_t *)0x106df1);
  return prVar1;
}

Assistant:

static roaring_bitmap_t *synthesized_xor(roaring_bitmap_t *r1,
                                         roaring_bitmap_t *r2) {
    unsigned universe_size = 0;
    roaring_statistics_t stats;
    roaring_bitmap_statistics(r1, &stats);
    universe_size = stats.max_value;
    roaring_bitmap_statistics(r2, &stats);
    if (stats.max_value > universe_size) universe_size = stats.max_value;

    roaring_bitmap_t *r1_or_r2 = roaring_bitmap_or(r1, r2);
    assert_true(roaring_bitmap_get_cardinality(r1_or_r2) ==
                roaring_bitmap_or_cardinality(r1, r2));

    roaring_bitmap_t *r1_and_r2 = roaring_bitmap_and(r1, r2);
    assert_true(roaring_bitmap_get_cardinality(r1_and_r2) ==
                roaring_bitmap_and_cardinality(r1, r2));

    roaring_bitmap_t *r1_nand_r2 =
        roaring_bitmap_flip(r1_and_r2, 0U, universe_size + 1U);
    roaring_bitmap_t *r1_xor_r2 = roaring_bitmap_and(r1_or_r2, r1_nand_r2);
    roaring_bitmap_free(r1_or_r2);
    roaring_bitmap_free(r1_and_r2);
    roaring_bitmap_free(r1_nand_r2);
    return r1_xor_r2;
}